

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall RefundIRCCommand::create(RefundIRCCommand *this)

{
  basic_string_view<char,_std::char_traits<char>_> bVar1;
  size_t local_60;
  char *local_58;
  size_t local_50;
  char *local_48;
  size_t local_40;
  char *local_38;
  size_t local_30;
  char *local_28;
  size_t local_20;
  char *local_18;
  RefundIRCCommand *this_local;
  
  bVar1 = sv("refund",6);
  local_20 = bVar1._M_len;
  local_18 = bVar1._M_str;
  Jupiter::Command::addTrigger(this,local_20,local_18);
  bVar1 = sv("givecredits",0xb);
  local_30 = bVar1._M_len;
  local_28 = bVar1._M_str;
  Jupiter::Command::addTrigger(this,local_30,local_28);
  bVar1 = sv("gc",2);
  local_40 = bVar1._M_len;
  local_38 = bVar1._M_str;
  Jupiter::Command::addTrigger(this,local_40,local_38);
  bVar1 = sv("money",5);
  local_50 = bVar1._M_len;
  local_48 = bVar1._M_str;
  Jupiter::Command::addTrigger(this,local_50,local_48);
  bVar1 = sv("credits",7);
  local_60 = bVar1._M_len;
  local_58 = bVar1._M_str;
  Jupiter::Command::addTrigger(this,local_60,local_58);
  IRCCommand::setAccessLevel((int)this);
  return;
}

Assistant:

void RefundIRCCommand::create() {
	this->addTrigger("refund"sv);
	this->addTrigger("givecredits"sv);
	this->addTrigger("gc"sv);
	this->addTrigger("money"sv);
	this->addTrigger("credits"sv);
	this->setAccessLevel(3);
}